

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O3

void anon_unknown.dwarf_b1b24::testRotation(V3f *from,V3f *to)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  V3f t0;
  V3f fQ0;
  M44f M;
  V3f n0;
  V3f fM0;
  V3f f0;
  Vec3<float> local_f0;
  Vec3<float> local_e4;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  undefined8 local_b8;
  float local_b0;
  float local_ac;
  undefined8 local_a8;
  float local_a0;
  float local_9c;
  undefined8 local_98;
  float local_90;
  Vec3<float> local_88;
  Vec3<float> local_7c;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  Vec3<float> local_54;
  Quat<float> local_48;
  
  local_48._0_12_ = ZEXT812(0x3f800000);
  local_48.v.z = 0.0;
  Imath_2_5::Quat<float>::setRotation(&local_48,from,to);
  Imath_2_5::Quat<float>::toMatrix44(&local_48);
  fVar10 = from->z;
  uVar1 = from->x;
  uVar4 = from->y;
  fVar16 = local_48.v.y;
  fVar18 = local_48.v.z;
  fVar19 = fVar10 * fVar16 - (float)uVar4 * fVar18;
  fVar20 = (float)uVar1 * fVar18 - fVar10 * local_48.v.x;
  fVar12 = (float)uVar4 * local_48.v.x - (float)uVar1 * fVar16;
  fVar13 = fVar12 * local_48.r + (fVar20 * local_48.v.x - fVar16 * fVar19);
  local_68 = fVar13 + fVar13 + fVar10;
  fVar17 = local_cc * (float)uVar1 + local_bc * (float)uVar4 + local_ac * fVar10 + local_9c;
  local_58 = (local_d0 * (float)uVar1 + local_c0 * (float)uVar4 + local_b0 * fVar10 + local_a0) /
             fVar17;
  fVar13 = local_48.r * fVar19 + (fVar12 * fVar16 - fVar20 * fVar18);
  fVar12 = local_48.r * fVar20 + (fVar19 * fVar18 - fVar12 * local_48.v.x);
  local_70 = CONCAT44(fVar12 + fVar12 + (float)uVar4,fVar13 + fVar13 + (float)uVar1);
  auVar14._0_4_ =
       (float)uVar1 * (float)local_d8 + (float)local_c8 * (float)uVar4 + fVar10 * (float)local_b8 +
       (float)local_a8;
  auVar14._4_4_ =
       (float)uVar1 * (float)((ulong)local_d8 >> 0x20) +
       (float)((ulong)local_c8 >> 0x20) * (float)uVar4 + fVar10 * (float)((ulong)local_b8 >> 0x20) +
       (float)((ulong)local_a8 >> 0x20);
  auVar14._8_4_ = (float)uVar1 * 0.0 + (float)uVar4 * 0.0 + 0.0 + 0.0;
  auVar14._12_4_ = (float)uVar1 * 0.0 + (float)uVar4 * 0.0 + 0.0 + 0.0;
  auVar15._4_4_ = fVar17;
  auVar15._0_4_ = fVar17;
  auVar15._8_8_ = 0;
  auVar15 = divps(auVar14,auVar15);
  local_60 = auVar15._0_8_;
  Imath_2_5::Vec3<float>::normalized(&local_f0);
  Imath_2_5::Vec3<float>::normalized(&local_7c);
  Imath_2_5::Vec3<float>::normalized(&local_e4);
  if ((float)(~-(uint)(local_7c.x < local_f0.x) & (uint)(local_7c.x - local_f0.x) |
             (uint)(local_f0.x - local_7c.x) & -(uint)(local_7c.x < local_f0.x)) <= 2.3841858e-06) {
    lVar8 = 1;
    do {
      lVar9 = lVar8;
      if (lVar9 == 3) goto LAB_00141043;
      fVar10 = (&local_f0.x)[lVar9];
      fVar13 = (&local_7c.x)[lVar9];
      lVar8 = lVar9 + 1;
    } while ((float)(~-(uint)(fVar13 < fVar10) & (uint)(fVar13 - fVar10) |
                    (uint)(fVar10 - fVar13) & -(uint)(fVar13 < fVar10)) <= 2.3841858e-06);
    if (1 < lVar9 - 1U) {
LAB_00141043:
      if ((float)(~-(uint)(local_e4.x < local_f0.x) & (uint)(local_e4.x - local_f0.x) |
                 (uint)(local_f0.x - local_e4.x) & -(uint)(local_e4.x < local_f0.x)) <=
          2.3841858e-06) {
        lVar8 = 1;
        do {
          lVar9 = lVar8;
          if (lVar9 == 3) goto LAB_001410b7;
          fVar10 = (&local_f0.x)[lVar9];
          fVar13 = (&local_e4.x)[lVar9];
          lVar8 = lVar9 + 1;
        } while ((float)(~-(uint)(fVar13 < fVar10) & (uint)(fVar13 - fVar10) |
                        (uint)(fVar10 - fVar13) & -(uint)(fVar13 < fVar10)) <= 2.3841858e-06);
        if (1 < lVar9 - 1U) {
LAB_001410b7:
          Imath_2_5::Vec3<float>::normalized(&local_54);
          if (0.9 <= ABS(local_54.z * local_f0.z + local_54.x * local_f0.x + local_54.y * local_f0.y
                        )) {
            return;
          }
          uVar2 = from->y;
          uVar5 = from->z;
          uVar3 = to->y;
          uVar6 = to->z;
          local_98 = CONCAT44(to->x * (float)uVar5 - from->x * (float)uVar6,
                              (float)uVar6 * (float)uVar2 - (float)uVar5 * (float)uVar3);
          local_90 = from->x * (float)uVar3 - to->x * (float)uVar2;
          Imath_2_5::Vec3<float>::normalized(&local_88);
          local_9c = local_ac * local_88.z + local_cc * local_88.x + local_bc * local_88.y +
                     local_9c;
          auVar11._0_4_ =
               local_88.z * (float)local_b8 +
               local_88.x * (float)local_d8 + (float)local_c8 * local_88.y + (float)local_a8;
          auVar11._4_4_ =
               local_88.z * (float)((ulong)local_b8 >> 0x20) +
               local_88.x * (float)((ulong)local_d8 >> 0x20) +
               (float)((ulong)local_c8 >> 0x20) * local_88.y + (float)((ulong)local_a8 >> 0x20);
          auVar11._8_4_ = local_88.z * 0.0 + local_88.x * 0.0 + local_88.y * 0.0 + 0.0;
          auVar11._12_4_ = local_88.z * 0.0 + local_88.x * 0.0 + local_88.y * 0.0 + 0.0;
          auVar7._4_4_ = local_9c;
          auVar7._0_4_ = local_9c;
          auVar7._8_4_ = local_9c;
          auVar7._12_4_ = local_9c;
          auVar15 = divps(auVar11,auVar7);
          local_98 = auVar15._0_8_;
          local_90 = (local_b0 * local_88.z + local_d0 * local_88.x + local_c0 * local_88.y +
                     local_a0) / local_9c;
          fVar10 = auVar15._0_4_;
          if ((float)(~-(uint)(fVar10 < local_88.x) & (uint)(fVar10 - local_88.x) |
                     (uint)(local_88.x - fVar10) & -(uint)(fVar10 < local_88.x)) <= 2.3841858e-06) {
            lVar8 = 1;
            do {
              lVar9 = lVar8;
              if (lVar9 == 3) {
                return;
              }
              fVar10 = (&local_88.x)[lVar9];
              fVar13 = *(float *)((long)&local_98 + lVar9 * 4);
              lVar8 = lVar9 + 1;
            } while ((float)(~-(uint)(fVar13 < fVar10) & (uint)(fVar13 - fVar10) |
                            (uint)(fVar10 - fVar13) & -(uint)(fVar13 < fVar10)) <= 2.3841858e-06);
            if (1 < lVar9 - 1U) {
              return;
            }
          }
          __assert_fail("n0.equalWithAbsError (n0M, e)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                        ,0x58,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
        }
      }
      __assert_fail("t0.equalWithAbsError (fQ0, e)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                    ,0x4b,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
    }
  }
  __assert_fail("t0.equalWithAbsError (fM0, e)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testQuatSetRotation.cpp"
                ,0x4a,"void (anonymous namespace)::testRotation(const V3f &, const V3f &)");
}

Assistant:

void
testRotation (const V3f &from, const V3f &to)
{
    //
    // Build a quaternion.
    //

    Quatf Q;
    Q.setRotation (from, to);
    M44f M = Q.toMatrix44();

    //
    // Verify that the quaternion rotates vector from into vector to.
    //

    float e = 20 * limits<float>::epsilon();

    V3f fromM = from * M;
    V3f fromQ = from * Q;
    V3f t0 = to.normalized();
    V3f fM0 = fromM.normalized();
    V3f fQ0 = fromQ.normalized();

    assert (t0.equalWithAbsError (fM0, e));
    assert (t0.equalWithAbsError (fQ0, e));

    //
    // Verify that the rotation axis is the cross product of from and to.
    //

    V3f f0 = from.normalized();

    if (abs (f0 ^ t0) < 0.9)
    {
	V3f n0 = (from % to).normalized();
	V3f n0M = n0 * M;

	assert (n0.equalWithAbsError (n0M, e));
    }
}